

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableauPileCollider.cpp
# Opt level: O2

Position __thiscall
solitaire::colliders::TableauPileCollider::getRelativeCardPosition
          (TableauPileCollider *this,uint index,uint topCoveredCardPosition)

{
  uint uVar1;
  
  uVar1 = index;
  if (topCoveredCardPosition < index) {
    uVar1 = topCoveredCardPosition;
  }
  if (index < topCoveredCardPosition) {
    index = topCoveredCardPosition;
  }
  return (Position)((ulong)(uVar1 * 3 + index * 0x10 + topCoveredCardPosition * -0x10) << 0x20);
}

Assistant:

Position TableauPileCollider::getRelativeCardPosition(
    const unsigned index, const unsigned topCoveredCardPosition) const
{
    int y = 0;
    for (unsigned i = 0; i < topCoveredCardPosition and i < index; ++i)
        y += Layout::coveredTableauPileCardsSpacing;
    for (unsigned i = topCoveredCardPosition; i < index; ++i)
        y += Layout::uncoveredTableauPileCardsSpacing;
    return Position {0, y};
}